

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void Encoder::EnsureRelocEntryIntegrity
               (size_t newBufferStartAddress,size_t codeSize,size_t oldBufferAddress,
               size_t relocAddress,uint offsetBytes,ptrdiff_t opndData,bool isRelativeAddr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t newBufferRelocAddr;
  size_t newBufferEndAddress;
  size_t targetBrAddress;
  bool isRelativeAddr_local;
  ptrdiff_t opndData_local;
  uint offsetBytes_local;
  size_t relocAddress_local;
  size_t oldBufferAddress_local;
  size_t codeSize_local;
  size_t newBufferStartAddress_local;
  
  if ((relocAddress < oldBufferAddress) || (oldBufferAddress + codeSize <= relocAddress)) {
    newBufferEndAddress = *(size_t *)relocAddress;
  }
  else {
    newBufferEndAddress = opndData;
    if (isRelativeAddr) {
      newBufferEndAddress =
           (relocAddress - oldBufferAddress) + newBufferStartAddress + (ulong)offsetBytes + opndData
      ;
    }
  }
  if ((newBufferStartAddress <= newBufferEndAddress) &&
     (newBufferEndAddress < newBufferStartAddress + codeSize)) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                     ,0x474,"(false)","false");
  if (bVar2) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void Encoder::EnsureRelocEntryIntegrity(size_t newBufferStartAddress, size_t codeSize, size_t oldBufferAddress, size_t relocAddress, uint offsetBytes, ptrdiff_t opndData, bool isRelativeAddr)
{
    size_t targetBrAddress = 0;
    size_t newBufferEndAddress = newBufferStartAddress + codeSize;

    //Handle Dictionary addresses here - The target address will be in the dictionary.
    if (relocAddress < oldBufferAddress || relocAddress >= (oldBufferAddress + codeSize))
    {
        targetBrAddress = (size_t)(*(size_t*)relocAddress);
    }
    else
    {
        size_t newBufferRelocAddr = relocAddress - oldBufferAddress + newBufferStartAddress;

        if (isRelativeAddr)
        {
            targetBrAddress = (size_t)newBufferRelocAddr + offsetBytes + opndData;
        }
        else  // Absolute Address
        {
            targetBrAddress = (size_t)opndData;
        }
    }

    if (targetBrAddress < newBufferStartAddress || targetBrAddress >= newBufferEndAddress)
    {
        Assert(false);
        Fatal();
    }
}